

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::LockFile(PosixEnv *this,string *filename,FileLock **lock)

{
  pthread_mutex_t *__mutex;
  int __fd;
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  undefined8 *in_RCX;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  Slice local_50;
  Slice local_40;
  
  *in_RCX = 0;
  __fd = open((char *)*lock,0x80042,0x1a4);
  if (__fd < 0) {
    __errno_location();
    PosixError((string *)this,(int)*lock);
  }
  else {
    __mutex = (pthread_mutex_t *)(filename + 6);
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&filename[7]._M_string_length,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
    pthread_mutex_unlock(__mutex);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      close(__fd);
      std::operator+(&local_98,"lock ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
      local_40.data_ = local_98._M_dataplus._M_p;
      local_40.size_ = local_98._M_string_length;
      local_50.data_ = "already held by process";
      local_50.size_ = 0x17;
      Status::Status((Status *)this,kIOError,&local_40,&local_50);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0;
      local_98.field_2._8_8_ = 0;
      local_98._M_dataplus._M_p = (pointer)0x1;
      local_98._M_string_length = 0;
      local_98.field_2._M_allocated_capacity = 0;
      iVar1 = fcntl(__fd,6);
      if (iVar1 != -1) {
        puVar3 = (undefined8 *)operator_new(0x30);
        local_70 = &local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,*lock,
                   (long)&(*lock)->_vptr_FileLock + (long)&lock[1]->_vptr_FileLock);
        *puVar3 = &PTR__PosixFileLock_00131c90;
        *(int *)(puVar3 + 1) = __fd;
        puVar3[2] = puVar3 + 4;
        if (local_70 == &local_60) {
          puVar3[4] = local_60;
          puVar3[5] = uStack_58;
        }
        else {
          puVar3[2] = local_70;
          puVar3[4] = local_60;
        }
        puVar3[3] = local_68;
        *in_RCX = puVar3;
        (this->super_Env)._vptr_Env = (_func_int **)0x0;
        return (Status)(char *)this;
      }
      close(__fd);
      PosixLockTable::Remove((PosixLockTable *)&__mutex->__data,(string *)lock);
      std::operator+(&local_98,"lock ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lock);
      PosixError((string *)this,(int)local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status LockFile(const std::string& filename, FileLock** lock) override {
    *lock = nullptr;

    int fd = ::open(filename.c_str(), O_RDWR | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!locks_.Insert(filename)) {
      ::close(fd);
      return Status::IOError("lock " + filename, "already held by process");
    }

    if (LockOrUnlock(fd, true) == -1) {
      int lock_errno = errno;
      ::close(fd);
      locks_.Remove(filename);
      return PosixError("lock " + filename, lock_errno);
    }

    *lock = new PosixFileLock(fd, filename);
    return Status::OK();
  }